

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O0

void __thiscall Assimp::STLExporter::WriteMeshBinary(STLExporter *this,aiMesh *m)

{
  undefined1 local_5e [2];
  float local_5c;
  float fStack_58;
  char dummy [2];
  float vz;
  float vy;
  float vx;
  aiVector3D *v;
  uint a_1;
  float nz;
  float ny;
  float nx;
  uint a;
  aiVector3D nor;
  aiFace *f;
  uint i;
  aiMesh *m_local;
  STLExporter *this_local;
  
  for (f._4_4_ = 0; f._4_4_ < m->mNumFaces; f._4_4_ = f._4_4_ + 1) {
    nor._4_8_ = m->mFaces + f._4_4_;
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&nx);
    if (m->mNormals != (aiVector3D *)0x0) {
      for (ny = 0.0; (uint)ny < (uint)*(float *)nor._4_8_; ny = (float)((int)ny + 1)) {
        aiVector3t<float>::operator+=
                  ((aiVector3t<float> *)&nx,
                   m->mNormals + *(uint *)(*(long *)(nor._4_8_ + 8) + (ulong)(uint)ny * 4));
      }
      aiVector3t<float>::Normalize((aiVector3t<float> *)&nx);
    }
    nz = nx;
    a_1 = a;
    v._4_4_ = nor.x;
    std::ostream::write((char *)this,(long)&nz);
    std::ostream::write((char *)this,(long)&a_1);
    std::ostream::write((char *)this,(long)&v + 4);
    for (v._0_4_ = 0; (uint)v < *(uint *)nor._4_8_; v._0_4_ = (uint)v + 1) {
      _vy = m->mVertices + *(uint *)(*(long *)(nor._4_8_ + 8) + (ulong)(uint)v * 4);
      vz = _vy->x;
      fStack_58 = _vy->y;
      local_5c = _vy->z;
      std::ostream::write((char *)this,(long)&vz);
      std::ostream::write((char *)this,(long)&stack0xffffffffffffffa8);
      std::ostream::write((char *)this,(long)&local_5c);
    }
    memset(local_5e,0,2);
    std::ostream::write((char *)this,(long)local_5e);
  }
  return;
}

Assistant:

void STLExporter::WriteMeshBinary(const aiMesh* m)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];
        // we need per-face normals. We specified aiProcess_GenNormals as pre-requisite for this exporter,
        // but nonetheless we have to expect per-vertex normals.
        aiVector3D nor;
        if (m->mNormals) {
            for(unsigned int a = 0; a < f.mNumIndices; ++a) {
                nor += m->mNormals[f.mIndices[a]];
            }
            nor.Normalize();
        }
        // STL binary files use 4-byte floats. This may possibly cause loss of precision
        // for clients using 8-byte doubles
        float nx = (float) nor.x;
        float ny = (float) nor.y;
        float nz = (float) nor.z;
        AI_SWAP4(nx); AI_SWAP4(ny); AI_SWAP4(nz);
        mOutput.write((char *)&nx, 4); mOutput.write((char *)&ny, 4); mOutput.write((char *)&nz, 4);
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const aiVector3D& v  = m->mVertices[f.mIndices[a]];
            float vx = (float) v.x, vy = (float) v.y, vz = (float) v.z;
            AI_SWAP4(vx); AI_SWAP4(vy); AI_SWAP4(vz);
            mOutput.write((char *)&vx, 4); mOutput.write((char *)&vy, 4); mOutput.write((char *)&vz, 4);
        }
        char dummy[2] = {0};
        mOutput.write(dummy, 2);
    }
}